

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O1

bool __thiscall
cmELFInternalImpl<cmELFTypes32>::LoadDynamicSection(cmELFInternalImpl<cmELFTypes32> *this)

{
  pointer paVar1;
  cmELF *pcVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  
  lVar6 = (long)(this->super_cmELFInternal).DynamicSectionIndex;
  if (-1 < lVar6) {
    if ((this->DynamicSectionEntries).super__Vector_base<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (this->DynamicSectionEntries).super__Vector_base<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      return true;
    }
    paVar1 = (this->SectionHeaders).super__Vector_base<Elf32_Shdr,_std::allocator<Elf32_Shdr>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (paVar1[lVar6].sh_entsize != 0) {
      uVar3 = (ulong)paVar1[lVar6].sh_size / (ulong)paVar1[lVar6].sh_entsize;
      iVar5 = (int)uVar3;
      std::vector<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>::resize
                (&this->DynamicSectionEntries,(long)iVar5);
      if (iVar5 < 1) {
        return iVar5 < 1;
      }
      lVar8 = 0;
      uVar7 = 0;
      do {
        std::istream::seekg((this->super_cmELFInternal).Stream._M_t.
                            super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>
                            ._M_head_impl,
                            paVar1[lVar6].sh_entsize * (int)uVar7 + paVar1[lVar6].sh_offset,0);
        bVar4 = Read(this,(ELF_Dyn *)
                          ((long)&((this->DynamicSectionEntries).
                                   super__Vector_base<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>._M_impl
                                   .super__Vector_impl_data._M_start)->d_tag + lVar8));
        if (!bVar4) {
          pcVar2 = (this->super_cmELFInternal).External;
          std::__cxx11::string::_M_replace
                    ((ulong)&pcVar2->ErrorMessage,0,(char *)(pcVar2->ErrorMessage)._M_string_length,
                     0x24d1b8);
          (this->super_cmELFInternal).ELFType = FileTypeInvalid;
          (this->super_cmELFInternal).DynamicSectionIndex = -1;
          return false;
        }
        uVar7 = uVar7 + 1;
        lVar8 = lVar8 + 8;
      } while (uVar7 < uVar3);
      return uVar7 >= uVar3;
    }
  }
  return false;
}

Assistant:

bool cmELFInternalImpl<Types>::LoadDynamicSection()
{
  // If there is no dynamic section we are done.
  if (this->DynamicSectionIndex < 0) {
    return false;
  }

  // If the section was already loaded we are done.
  if (!this->DynamicSectionEntries.empty()) {
    return true;
  }

  // If there are no entries we are done.
  ELF_Shdr const& sec = this->SectionHeaders[this->DynamicSectionIndex];
  if (sec.sh_entsize == 0) {
    return false;
  }

  // Allocate the dynamic section entries.
  int n = static_cast<int>(sec.sh_size / sec.sh_entsize);
  this->DynamicSectionEntries.resize(n);

  // Read each entry.
  for (int j = 0; j < n; ++j) {
    // Seek to the beginning of the section entry.
    this->Stream->seekg(sec.sh_offset + sec.sh_entsize * j);
    ELF_Dyn& dyn = this->DynamicSectionEntries[j];

    // Try reading the entry.
    if (!this->Read(dyn)) {
      this->SetErrorMessage("Error reading entry from DYNAMIC section.");
      this->DynamicSectionIndex = -1;
      return false;
    }
  }
  return true;
}